

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_ModelTest::ReadTest
          (ONX_ModelTest *this,FILE *fp,Type test_type,bool bKeepModels,wchar_t *text_log_file_path,
          ON_TextLog *text_log)

{
  bool bVar1;
  ON_TextLogNull devnull;
  ON_BinaryFile archive;
  ON_TextLog local_2d8;
  ON_BinaryFile local_260;
  
  Internal_BeginTest(this);
  ON_TextLog::ON_TextLog(&local_2d8);
  local_2d8._vptr_ON_TextLog = (_func_int **)&PTR__ON_TextLog_0081e4d8;
  if (text_log == (ON_TextLog *)0x0) {
    text_log = &ON_TextLog::Null;
  }
  if (fp == (FILE *)0x0) {
    this->m_error_counts[0].m_failure_count = this->m_error_counts[0].m_failure_count + 1;
    ON_TextLog::Print(text_log,"fp is nullptr.");
  }
  else {
    ON_BinaryFile::ON_BinaryFile(&local_260,read3dm,fp);
    Internal_ReadTest(this,&local_260.super_ON_BinaryArchive,test_type,bKeepModels,
                      text_log_file_path,text_log);
    ON_BinaryFile::~ON_BinaryFile(&local_260);
  }
  bVar1 = Internal_TallyTestResults(this);
  ON_TextLog::~ON_TextLog(&local_2d8);
  return bVar1;
}

Assistant:

bool ONX_ModelTest::ReadTest(
  FILE* fp,
  ONX_ModelTest::Type test_type,
  bool bKeepModels,
  const wchar_t* text_log_file_path,
  ON_TextLog* text_log
)
{
  Internal_BeginTest();

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  for (;;)
  {
    if (nullptr == fp)
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("fp is nullptr.");
      break;
    }

    ON_BinaryFile archive(ON::archive_mode::read3dm, fp);

    Internal_ReadTest(archive, test_type, bKeepModels, text_log_file_path, text_log);
    break;
  }

  return Internal_TallyTestResults();
}